

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3RenameExprUnmap(Parse *pParse,Expr *pExpr)

{
  u8 uVar1;
  Walker sWalker;
  Walker local_48;
  
  uVar1 = pParse->eParseMode;
  local_48.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
  local_48.walkerDepth = 0;
  local_48.eCode = 0;
  local_48.mWFlags = 0;
  local_48.u.pNC = (NameContext *)0x0;
  local_48.xExprCallback = renameUnmapExprCb;
  local_48.xSelectCallback = renameUnmapSelectCb;
  pParse->eParseMode = '\x03';
  if (pExpr != (Expr *)0x0) {
    local_48.pParse = pParse;
    sqlite3WalkExprNN(&local_48,pExpr);
  }
  pParse->eParseMode = uVar1;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RenameExprUnmap(Parse *pParse, Expr *pExpr){
  u8 eMode = pParse->eParseMode;
  Walker sWalker;
  memset(&sWalker, 0, sizeof(Walker));
  sWalker.pParse = pParse;
  sWalker.xExprCallback = renameUnmapExprCb;
  sWalker.xSelectCallback = renameUnmapSelectCb;
  pParse->eParseMode = PARSE_MODE_UNMAP;
  sqlite3WalkExpr(&sWalker, pExpr);
  pParse->eParseMode = eMode;
}